

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int grapg_5_3::dfs(graph g,int v)

{
  int iVar1;
  enode *peVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  graph *pgVar7;
  undefined8 *puVar8;
  uint in_stack_00000118;
  int aiStackY_130 [12];
  uint auStackY_100 [10];
  graph in_stack_ffffffffffffff58;
  
  (&visited)[v] = 1;
  peVar2 = (enode *)(g.vexs + v);
  do {
    peVar2 = peVar2->next;
    iVar4 = peVar2->adjvex;
  } while ((&visited)[iVar4] != 0);
  pgVar7 = &g;
  puVar8 = (undefined8 *)&stack0xffffffffffffff58;
  for (lVar5 = 0x15; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar8 = *(undefined8 *)pgVar7->vexs;
    pgVar7 = (graph *)&pgVar7->vexs[0].edge;
    puVar8 = puVar8 + 1;
  }
  dfs(in_stack_ffffffffffffff58,iVar4);
  auStackY_100[0] = 0;
  for (lVar5 = 1; lVar5 < (int)in_stack_00000118; lVar5 = lVar5 + 1) {
    aiStackY_130[lVar5] = *(int *)(&stack0xffffffffffffff60 + lVar5 * 4);
    auStackY_100[lVar5] = 0;
  }
  do {
    iVar4 = 0x540be3ff;
    uVar6 = 0;
    for (uVar3 = 1; in_stack_00000118 != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = aiStackY_130[uVar3];
      if (iVar1 != 0 && iVar1 < iVar4) {
        uVar6 = uVar3 & 0xffffffff;
        iVar4 = iVar1;
      }
    }
    lVar5 = (long)(int)(uint)uVar6;
    printf("%d %d",(ulong)auStackY_100[lVar5],uVar6);
    aiStackY_130[lVar5] = 0;
    for (uVar3 = 1; in_stack_00000118 != uVar3; uVar3 = uVar3 + 1) {
      if ((aiStackY_130[uVar3] != 0) &&
         (*(int *)(&stack0xffffffffffffff60 + uVar3 * 4 + lVar5 * 0x28) < aiStackY_130[uVar3])) {
        aiStackY_130[uVar3] = *(int *)(&stack0xffffffffffffff60 + uVar3 * 4 + lVar5 * 0x28);
        auStackY_100[uVar3] = (uint)uVar6;
      }
    }
  } while( true );
}

Assistant:

int dfs(graph g, int v) {
        visited[v] = 1;
        //visit;
        enode *e = g.vexs[v].edge;
        while (e != nullptr) {
            if (visited[e->adjvex] == 0)
                dfs(g, e->adjvex);
            e = e->next;
        }
    }